

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void polyscope::view::flyToHomeView(void)

{
  mat4x4 T;
  mat4 mStack_48;
  
  computeHomeView();
  nearClipRatio = 0x3f747ae147ae147b;
  farClipRatio = 0x4034000000000000;
  startFlightTo(&mStack_48,45.0,0.4);
  return;
}

Assistant:

void flyToHomeView() {

  // WARNING: Duplicated here and in resetCameraToHomeView()

  glm::mat4x4 T = computeHomeView();

  float Tfov = defaultFov;
  nearClipRatio = defaultNearClipRatio;
  farClipRatio = defaultFarClipRatio;

  startFlightTo(T, Tfov);
}